

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O2

void __thiscall Pyraminx::print(Pyraminx *this)

{
  int iVar1;
  int entry_1;
  int layer_1;
  int iVar2;
  int layer;
  int iVar3;
  int entry;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  iVar2 = 1;
  iVar5 = 6;
  for (iVar3 = 0; iVar4 = iVar3, iVar3 != 4; iVar3 = iVar3 + 1) {
    while (iVar4 != 0) {
      putchar(0x20);
      iVar4 = iVar4 + -1;
    }
    for (iVar4 = iVar5; iVar4 != -1; iVar4 = iVar4 + -1) {
      Face::print_triangle
                ((this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,L,
                 3 - iVar3,iVar4);
    }
    putchar(0x20);
    for (iVar4 = 0; iVar2 != iVar4; iVar4 = iVar4 + 1) {
      Face::print_triangle
                ((this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,
                 iVar3,iVar4);
    }
    putchar(0x20);
    for (iVar4 = iVar5; iVar1 = iVar3, iVar4 != -1; iVar4 = iVar4 + -1) {
      Face::print_triangle
                ((this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,R,
                 3 - iVar3,iVar4);
    }
    while (iVar1 != 0) {
      putchar(0x20);
      iVar1 = iVar1 + -1;
    }
    putchar(10);
    iVar2 = iVar2 + 2;
    iVar5 = iVar5 + -2;
  }
  for (iVar2 = 3; -1 < iVar2; iVar2 = iVar2 + -1) {
    iVar4 = iVar2 * 2;
    printf("     ");
    iVar3 = iVar2 * -2 + 6 >> 1;
    iVar5 = iVar3;
    if (iVar3 < 1) {
      iVar3 = 0;
      iVar5 = 0;
    }
    while (iVar3 != 0) {
      putchar(0x20);
      iVar3 = iVar3 + -1;
    }
    for (; -1 < iVar4; iVar4 = iVar4 + -1) {
      Face::print_triangle
                ((this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,B,
                 iVar2,iVar4);
    }
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      putchar(0x20);
    }
    putchar(10);
  }
  return;
}

Assistant:

void Pyraminx::print(){
    for(int layer = 0; layer < 4; layer++){
        int top_row_len = 2*layer +1;
        int bottom_row_len = (7- top_row_len) + 1;
        for(int j = 0; j < (7-bottom_row_len)/2; j++){
            printf(" ");
        }
        for(int entry = 0; entry < bottom_row_len; entry++){
            red_face->print_triangle(Corner::L, 3-layer, (bottom_row_len - 1) - entry);
        }
        printf(" ");
        for(int entry = 0; entry < top_row_len; entry++){
            blue_face->print_triangle(Corner::U, layer, entry);
        }
        printf(" ");
        for(int entry = 0; entry < bottom_row_len; entry++){
            yellow_face->print_triangle(Corner::R, 3-layer, (bottom_row_len - 1) - entry);
        }
        for(int j = 0; j < (7-bottom_row_len)/2; j++){
                printf(" ");
        }
        printf("\n");
    }
    for(int layer = 3; layer >=0; layer--){
        int row_len = layer*2 + 1;
        printf("     "); // Offset so green appears below blue
        for(int j = 0; j < (7 - row_len)/2; j++){
                printf(" ");
        }
        for(int entry = row_len - 1; entry >= 0; entry--){
            green_face->print_triangle(Corner::B, layer, entry);
        }
        for(int j = 0; j < (7 - row_len)/2; j++){
                printf(" ");
        }
        printf("\n");
    }
}